

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

int __thiscall
embree::SceneGraph::SubdivMeshNode::verify
          (SubdivMeshNode *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  runtime_error *prVar4;
  ulong uVar5;
  reference puVar6;
  uint crease_1;
  const_iterator __end1_5;
  const_iterator __begin1_5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_5;
  Vec2<int> *crease;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *__range1_4;
  uint i_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_3;
  uint i_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_2;
  uint i_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  uint i;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_1;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range1;
  size_t N;
  SubdivMeshNode *in_stack_fffffffffffffe48;
  __normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  *in_stack_fffffffffffffe50;
  ulong local_180;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_108;
  reference local_100;
  Vec2<int> *local_f8;
  __normal_iterator<const_embree::Vec2<int>_*,_std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>_>
  local_f0;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *local_e8;
  uint local_dc;
  uint *local_d8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c8;
  uint local_bc;
  uint *local_b8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a8;
  uint local_9c;
  uint *local_98;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  uint local_7c;
  uint *local_78;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  reference local_60;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *local_58;
  __normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_50;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *local_48;
  size_t local_30;
  SubdivMeshNode *local_28;
  const_reference local_20;
  reference local_18;
  ulong local_10;
  ulong local_8;
  
  local_28 = this;
  local_30 = numPositions(in_stack_fffffffffffffe48);
  sVar2 = std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::size(&this->normals);
  if (sVar2 != 0) {
    sVar2 = std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::size(&this->normals);
    sVar3 = std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::size(&this->positions);
    if (sVar2 != sVar3) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"incompatible number of time steps");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_48 = &this->positions;
  local_50._M_current =
       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ::begin((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                *)in_stack_fffffffffffffe48);
  local_58 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
             std::
             vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ::end((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    *)in_stack_fffffffffffffe48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffe50,
                       (__normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        *)in_stack_fffffffffffffe48);
    if (!bVar1) {
      local_68 = &this->position_indices;
      local_70._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffffe48);
      local_78 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    in_stack_fffffffffffffe48);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_stack_fffffffffffffe50,
                           (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_stack_fffffffffffffe48);
        if (!bVar1) {
          sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (&this->normal_indices);
          if (sVar2 != 0) {
            local_88 = &this->normal_indices;
            local_90._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    in_stack_fffffffffffffe48);
            local_98 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                          in_stack_fffffffffffffe48);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)in_stack_fffffffffffffe50,
                                      (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)in_stack_fffffffffffffe48), bVar1) {
              puVar6 = __gnu_cxx::
                       __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator*(&local_90);
              local_9c = *puVar6;
              uVar5 = (ulong)local_9c;
              local_20 = std::
                         vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ::operator[](&this->normals,0);
              if (local_20->size_active <= uVar5) {
                prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar4,"invalid normal index array");
                __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&local_90);
            }
          }
          local_a8 = &this->texcoord_indices;
          local_b0._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_fffffffffffffe48);
          local_b8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffffe48);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)in_stack_fffffffffffffe50,
                               (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)in_stack_fffffffffffffe48);
            if (!bVar1) {
              local_c8 = &this->holes;
              local_d0._M_current =
                   (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      in_stack_fffffffffffffe48);
              local_d8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                            in_stack_fffffffffffffe48);
              while( true ) {
                bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    *)in_stack_fffffffffffffe50,
                                   (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    *)in_stack_fffffffffffffe48);
                if (!bVar1) {
                  local_e8 = &this->edge_creases;
                  local_f0._M_current =
                       (Vec2<int> *)
                       std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::begin
                                 ((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
                                  in_stack_fffffffffffffe48);
                  local_f8 = (Vec2<int> *)
                             std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::
                             end((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
                                 in_stack_fffffffffffffe48);
                  while( true ) {
                    bVar1 = __gnu_cxx::operator!=
                                      ((__normal_iterator<const_embree::Vec2<int>_*,_std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>_>
                                        *)in_stack_fffffffffffffe50,
                                       (__normal_iterator<const_embree::Vec2<int>_*,_std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>_>
                                        *)in_stack_fffffffffffffe48);
                    if (!bVar1) {
                      sVar2 = std::vector<float,_std::allocator<float>_>::size
                                        (&this->edge_crease_weights);
                      sVar3 = std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::
                              size(&this->edge_creases);
                      if (sVar2 != sVar3) {
                        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar4,"invalid edge crease weight array")
                        ;
                        __cxa_throw(prVar4,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      local_108 = &this->vertex_creases;
                      local_110._M_current =
                           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *
                                              )in_stack_fffffffffffffe48);
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 in_stack_fffffffffffffe48);
                      while( true ) {
                        bVar1 = __gnu_cxx::operator!=
                                          ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                            *)in_stack_fffffffffffffe50,
                                           (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                            *)in_stack_fffffffffffffe48);
                        if (!bVar1) {
                          sVar2 = std::vector<float,_std::allocator<float>_>::size
                                            (&this->vertex_crease_weights);
                          sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                            (&this->vertex_creases);
                          if (sVar2 == sVar3) {
                            return (int)sVar2;
                          }
                          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar4,"invalid vertex crease weight array");
                          __cxa_throw(prVar4,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        puVar6 = __gnu_cxx::
                                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 ::operator*(&local_110);
                        if (local_30 <= *puVar6) break;
                        __gnu_cxx::
                        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator++(&local_110);
                      }
                      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar4,"invalid vertex crease array");
                      __cxa_throw(prVar4,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_100 = __gnu_cxx::
                                __normal_iterator<const_embree::Vec2<int>_*,_std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>_>
                                ::operator*(&local_f0);
                    local_8 = (ulong)(local_100->field_0).field_0.x;
                    local_10 = (ulong)(local_100->field_0).field_0.y;
                    local_180 = local_8;
                    if (local_8 < local_10) {
                      local_180 = local_10;
                    }
                    if (local_30 <= local_180) break;
                    __gnu_cxx::
                    __normal_iterator<const_embree::Vec2<int>_*,_std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>_>
                    ::operator++(&local_f0);
                  }
                  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar4,"invalid edge crease array");
                  __cxa_throw(prVar4,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                puVar6 = __gnu_cxx::
                         __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         ::operator*(&local_d0);
                local_dc = *puVar6;
                uVar5 = (ulong)local_dc;
                sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                  (&this->verticesPerFace);
                if (sVar2 <= uVar5) break;
                __gnu_cxx::
                __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator++(&local_d0);
              }
              prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar4,"invalid hole index array");
              __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            puVar6 = __gnu_cxx::
                     __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator*(&local_b0);
            local_bc = *puVar6;
            uVar5 = (ulong)local_bc;
            sVar2 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::size
                              (&this->texcoords);
            if (sVar2 <= uVar5) break;
            __gnu_cxx::
            __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator++(&local_b0);
          }
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"invalid texcoord index array");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_70);
        local_7c = *puVar6;
        if (local_30 <= local_7c) break;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_70);
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"invalid position index array");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_60 = __gnu_cxx::
               __normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
               ::operator*(&local_50);
    local_18 = local_60;
    if (local_60->size_active != local_30) break;
    __gnu_cxx::
    __normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
    ::operator++(&local_50);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"incompatible position array sizes");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SceneGraph::SubdivMeshNode::verify() const
  {
    const size_t N = numPositions();
    if (normals.size() && normals.size() != positions.size())
       THROW_RUNTIME_ERROR("incompatible number of time steps");
    for (const auto& p : positions) 
      if (p.size() != N) 
        THROW_RUNTIME_ERROR("incompatible position array sizes");
    for (auto i : position_indices) 
      if (size_t(i) >= N) THROW_RUNTIME_ERROR("invalid position index array");
    if (normal_indices.size())
      for (auto i : normal_indices) 
        if (size_t(i) >= normals[0].size()) THROW_RUNTIME_ERROR("invalid normal index array");
    for (auto i : texcoord_indices) 
      if (size_t(i) >= texcoords.size()) THROW_RUNTIME_ERROR("invalid texcoord index array");
    for (auto i : holes) 
      if (size_t(i) >= verticesPerFace.size()) THROW_RUNTIME_ERROR("invalid hole index array");
    for (auto& crease : edge_creases) 
      if (max(size_t(crease.x),size_t(crease.y)) >= N) THROW_RUNTIME_ERROR("invalid edge crease array");
    if (edge_crease_weights.size() != edge_creases.size())
      THROW_RUNTIME_ERROR("invalid edge crease weight array");
    for (auto crease : vertex_creases) 
      if (size_t(crease) >= N) THROW_RUNTIME_ERROR("invalid vertex crease array");
    if (vertex_crease_weights.size() != vertex_creases.size())
      THROW_RUNTIME_ERROR("invalid vertex crease weight array");
  }